

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *c;
  string<char> local_30;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = this->P + 1;
  pcVar3 = c;
  do {
    this->P = pcVar3;
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar1 != '>');
  pcVar3 = this->P;
  iVar2 = isspace((int)pcVar3[-1]);
  while (iVar2 != 0) {
    this->P = pcVar3 + -1;
    iVar2 = isspace((int)pcVar3[-2]);
    pcVar3 = pcVar3 + -1;
  }
  core::string<char>::string<char>(&local_30,c,(int)pcVar3 - (int)c);
  core::string<char>::operator=(&this->NodeName,&local_30);
  if (local_30.array != (char *)0x0) {
    operator_delete__(local_30.array);
  }
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}